

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void MetaEnum(node *p,array *List)

{
  nodeclass *Class_00;
  nodeclass *Class;
  array *List_local;
  node *p_local;
  
  List->_Begin = (char *)0x0;
  List->_Used = 0;
  Class_00 = (nodeclass *)((long)p->VMT + -0x48);
  if (Class_00 != (nodeclass *)0x0) {
    MetaEnumClass(Class_00,List);
  }
  return;
}

Assistant:

static void MetaEnum(node* p,array* List)
{
    const nodeclass* Class;
    ArrayInit(List);
    Class = NodeGetClass(p);
    if (Class)
        MetaEnumClass(Class,List);
}